

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

uint64 Time::getTimeWithBaseHiRes(uint64 base)

{
  long lVar1;
  int iVar2;
  long lVar3;
  TimeVal now;
  timespec local_30;
  timeval local_20;
  
  iVar2 = clock_gettime(1,&local_30);
  if (iVar2 != 0) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    local_30.tv_sec = local_20.tv_sec;
    local_30.tv_nsec = local_20.tv_usec * 1000;
  }
  getInitialTimespec();
  lVar1 = local_30.tv_nsec + getInitialTimespec::ts.tv_nsec;
  lVar3 = local_30.tv_nsec + -1000000000 + getInitialTimespec::ts.tv_nsec;
  if (lVar1 < 0x3b9aca01) {
    lVar3 = lVar1;
  }
  return ((ulong)(1000000000 < lVar1) + local_30.tv_sec + getInitialTimespec::ts.tv_sec) * base +
         (lVar3 * base) / 1000000000;
}

Assistant:

uint64 getTimeWithBaseHiRes(const uint64 base)
    {
#ifdef _WIN32
        FILETIME ft;
        initHighFreqFunc();
        pGetSystemTimePreciseAsFileTime(&ft);
        LARGE_INTEGER ul;
        ul.LowPart = ft.dwLowDateTime;
        ul.HighPart = ft.dwHighDateTime;
    
        return multDiv(ul.QuadPart - EPOCH_DIFF, base, RATE_DIFF);
#elif defined(_LINUX)
        struct timespec ts;
        if (clock_gettime(CLOCK_MONOTONIC, &ts) != 0)
        {
            TimeVal now;
            gettimeofday(&now, NULL);
            ts.tv_sec = now.tv_sec;
            ts.tv_nsec = now.tv_usec * 1000;
        }
        struct timespec init = getInitialTimespec();
        ts.tv_nsec += init.tv_nsec; ts.tv_sec += init.tv_sec;
        if (ts.tv_nsec > 1000000000) { ts.tv_sec ++; ts.tv_nsec -= 1000000000; }

        uint64 fracPart = (uint64)ts.tv_nsec * base;
        uint64 longTimeInBase = ((uint64)ts.tv_sec * base) + (uint64)(fracPart / 1000000000);
        return longTimeInBase;
#elif defined(_MAC)
        uint64 now = mach_absolute_time() + getInitialTimespec();

        static mach_timebase_info_data_t    sTimebaseInfo;
        
        if ( sTimebaseInfo.denom == 0 )
            (void) mach_timebase_info(&sTimebaseInfo);
        
        return multDiv (now * sTimebaseInfo.numer, base, sTimebaseInfo.denom * 1000000000);
#else
        TimeVal now;
        gettimeofday(&now, NULL);

        uint64 fracPart = (uint64)now.tv_usec * base;
        uint64 longTimeInBase = ((uint64)now.tv_sec * base) + (uint64)(fracPart / 1000000);
        return longTimeInBase;
#endif
    }